

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O2

MPP_RET mpp_enc_roi_deinit(MppEncRoiCtx ctx)

{
  MppEncRoiImpl *impl;
  
  if (ctx != (MppEncRoiCtx)0x0) {
    if (*(long *)((long)ctx + 0x48) != 0) {
      mpp_buffer_put_with_caller(*(long *)((long)ctx + 0x48),"mpp_enc_roi_deinit");
      *(undefined8 *)((long)ctx + 0x48) = 0;
    }
    if (*(long *)((long)ctx + 0x50) != 0) {
      mpp_buffer_put_with_caller(*(long *)((long)ctx + 0x50),"mpp_enc_roi_deinit");
      *(undefined8 *)((long)ctx + 0x50) = 0;
    }
    if (*(long *)((long)ctx + 0x58) != 0) {
      mpp_buffer_put_with_caller(*(long *)((long)ctx + 0x58),"mpp_enc_roi_deinit");
      *(undefined8 *)((long)ctx + 0x58) = 0;
    }
    if (*(long *)((long)ctx + 0x60) != 0) {
      mpp_buffer_put_with_caller(*(long *)((long)ctx + 0x60),"mpp_enc_roi_deinit");
      *(undefined8 *)((long)ctx + 0x60) = 0;
    }
    if (*(long *)((long)ctx + 0x40) != 0) {
      mpp_buffer_group_put();
      *(undefined8 *)((long)ctx + 0x40) = 0;
    }
    if (*(long *)((long)ctx + 0xa8) != 0) {
      mpp_osal_free("mpp_enc_roi_deinit");
    }
    *(undefined8 *)((long)ctx + 0xa8) = 0;
    if (*(long *)((long)ctx + 0x38) != 0) {
      mpp_osal_free("mpp_enc_roi_deinit");
    }
    *(undefined8 *)((long)ctx + 0x38) = 0;
    if (*(long *)((long)ctx + 0x10) != 0) {
      mpp_osal_free("mpp_enc_roi_deinit");
    }
    *(undefined8 *)((long)ctx + 0x10) = 0;
    if (*(long *)((long)ctx + 0xb8) != 0) {
      mpp_osal_free("mpp_enc_roi_deinit");
    }
    *(undefined8 *)((long)ctx + 0xb8) = 0;
    mpp_osal_free("mpp_enc_roi_deinit",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_roi_deinit(MppEncRoiCtx ctx)
{
    MppEncRoiImpl *impl = (MppEncRoiImpl *)ctx;

    if (!impl)
        return MPP_OK;

    if (impl->roi_cfg.base_cfg_buf) {
        mpp_buffer_put(impl->roi_cfg.base_cfg_buf);
        impl->roi_cfg.base_cfg_buf = NULL;
    }

    if (impl->roi_cfg.qp_cfg_buf) {
        mpp_buffer_put(impl->roi_cfg.qp_cfg_buf);
        impl->roi_cfg.qp_cfg_buf = NULL;
    }
    if (impl->roi_cfg.amv_cfg_buf) {
        mpp_buffer_put(impl->roi_cfg.amv_cfg_buf);
        impl->roi_cfg.amv_cfg_buf = NULL;
    }
    if (impl->roi_cfg.mv_cfg_buf) {
        mpp_buffer_put(impl->roi_cfg.mv_cfg_buf);
        impl->roi_cfg.mv_cfg_buf = NULL;
    }

    if (impl->roi_grp) {
        mpp_buffer_group_put(impl->roi_grp);
        impl->roi_grp = NULL;
    }
    MPP_FREE(impl->cu_map);
    MPP_FREE(impl->legacy_roi_region);
    MPP_FREE(impl->regions);
    MPP_FREE(impl->tmp);

    MPP_FREE(impl);
    return MPP_OK;
}